

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void __thiscall flatbuffers::Parser::Serialize(Parser *this)

{
  FlatBufferBuilder *this_00;
  string *project;
  uoffset_t start;
  StructDef *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long lVar3;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  __last;
  __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  __last_00;
  uint64_t uVar4;
  undefined8 uVar5;
  uint uVar6;
  Offset<reflection::Object> OVar7;
  Offset<reflection::Enum> OVar8;
  Offset<reflection::Service> OVar9;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> off;
  Offset<reflection::SchemaFile> table;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>_> off_00;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>_> OVar10;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>_> OVar11;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_> off_01;
  Offset<reflection::Schema> root;
  ulong uVar12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  pointer ppSVar15;
  pointer ppEVar16;
  pointer ppSVar17;
  Parser *pPVar18;
  _Self __tmp;
  Offset<flatbuffers::String> *v;
  Offset<reflection::SchemaFile> *v_00;
  Offset<reflection::Object> *v_01;
  Offset<reflection::Enum> *v_02;
  Offset<reflection::Service> *v_03;
  _Self __tmp_1;
  Offset<reflection::Object> offset;
  vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  included_files;
  vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
  schema_files;
  vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
  service_offsets;
  vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
  enum_offsets;
  vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
  object_offsets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_148;
  Parser *local_128;
  Offset<flatbuffers::String> local_11c;
  Offset<flatbuffers::String> *local_118;
  iterator iStack_110;
  Offset<flatbuffers::String> *local_108;
  Offset<reflection::SchemaFile> *local_f8;
  iterator iStack_f0;
  Offset<reflection::SchemaFile> *local_e8;
  Offset<reflection::Service> *local_d8;
  iterator iStack_d0;
  Offset<reflection::Service> *local_c8;
  Offset<reflection::Enum> *local_b8;
  iterator iStack_b0;
  Offset<reflection::Enum> *local_a8;
  Offset<reflection::Object> *local_98;
  iterator iStack_90;
  Offset<reflection::Object> *local_88;
  _Base_ptr local_78;
  _Base_ptr local_70;
  Offset<flatbuffers::String> local_64;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  this_00 = &this->builder_;
  FlatBufferBuilderImpl<false>::Clear(this_00);
  std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::vector
            ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *)
             &local_60,&(this->structs_).vec);
  uVar5 = local_60._M_impl._0_8_;
  __last._M_current._4_4_ = local_60._M_impl.super__Rb_tree_header._M_header._4_4_;
  __last._M_current._0_4_ = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
  if ((StructDef **)local_60._M_impl._0_8_ != __last._M_current) {
    uVar12 = (long)__last._M_current - local_60._M_impl._0_8_ >> 3;
    lVar3 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<flatbuffers::StructDef**,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(flatbuffers::StructDef_const*,flatbuffers::StructDef_const*)>>
              ((__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                )local_60._M_impl._0_8_,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_flatbuffers::StructDef_*,_const_flatbuffers::StructDef_*)>
                )0x127853);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<flatbuffers::StructDef**,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(flatbuffers::StructDef_const*,flatbuffers::StructDef_const*)>>
              ((__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                )uVar5,__last,
               (_Iter_comp_iter<bool_(*)(const_flatbuffers::StructDef_*,_const_flatbuffers::StructDef_*)>
                )0x127853);
  }
  uVar6 = (uint)((ulong)(CONCAT44(local_60._M_impl.super__Rb_tree_header._M_header._4_4_,
                                  local_60._M_impl.super__Rb_tree_header._M_header._M_color) -
                        local_60._M_impl._0_8_) >> 3);
  if (0 < (int)uVar6) {
    uVar12 = 0;
    do {
      ((*(StructDef **)(local_60._M_impl._0_8_ + uVar12 * 8))->super_Definition).index = (int)uVar12
      ;
      uVar12 = uVar12 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar12);
  }
  if ((StructDef **)local_60._M_impl._0_8_ != (StructDef **)0x0) {
    operator_delete((void *)local_60._M_impl._0_8_,
                    (long)local_60._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_60._M_impl._0_8_);
  }
  std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::vector
            ((vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *)&local_60,
             &(this->enums_).vec);
  uVar5 = local_60._M_impl._0_8_;
  __last_00._M_current._4_4_ = local_60._M_impl.super__Rb_tree_header._M_header._4_4_;
  __last_00._M_current._0_4_ = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
  if ((EnumDef **)local_60._M_impl._0_8_ != __last_00._M_current) {
    uVar12 = (long)__last_00._M_current - local_60._M_impl._0_8_ >> 3;
    lVar3 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<flatbuffers::EnumDef**,std::vector<flatbuffers::EnumDef*,std::allocator<flatbuffers::EnumDef*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(flatbuffers::EnumDef_const*,flatbuffers::EnumDef_const*)>>
              ((__normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                )local_60._M_impl._0_8_,__last_00,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_flatbuffers::EnumDef_*,_const_flatbuffers::EnumDef_*)>
                )0x12794c);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<flatbuffers::EnumDef**,std::vector<flatbuffers::EnumDef*,std::allocator<flatbuffers::EnumDef*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(flatbuffers::EnumDef_const*,flatbuffers::EnumDef_const*)>>
              ((__normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                )uVar5,__last_00,
               (_Iter_comp_iter<bool_(*)(const_flatbuffers::EnumDef_*,_const_flatbuffers::EnumDef_*)>
                )0x12794c);
  }
  uVar6 = (uint)((ulong)(CONCAT44(local_60._M_impl.super__Rb_tree_header._M_header._4_4_,
                                  local_60._M_impl.super__Rb_tree_header._M_header._M_color) -
                        local_60._M_impl._0_8_) >> 3);
  if (0 < (int)uVar6) {
    uVar12 = 0;
    do {
      ((*(pointer)(local_60._M_impl._0_8_ + uVar12 * 8))->super_Definition).index = (int)uVar12;
      uVar12 = uVar12 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar12);
  }
  if ((pointer)local_60._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_60._M_impl._0_8_,
                    (long)local_60._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_60._M_impl._0_8_);
  }
  local_88 = (Offset<reflection::Object> *)0x0;
  local_98 = (Offset<reflection::Object> *)0x0;
  iStack_90._M_current = (Offset<reflection::Object> *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_60 + 8);
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppSVar15 = (this->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_128 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppSVar15 !=
      (this->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      OVar7 = StructDef::Serialize(*ppSVar15,this_00,local_128);
      local_148._M_dataplus._M_p._0_4_ = OVar7.o;
      if (iStack_90._M_current == local_88) {
        std::
        vector<flatbuffers::Offset<reflection::Object>,std::allocator<flatbuffers::Offset<reflection::Object>>>
        ::_M_realloc_insert<flatbuffers::Offset<reflection::Object>const&>
                  ((vector<flatbuffers::Offset<reflection::Object>,std::allocator<flatbuffers::Offset<reflection::Object>>>
                    *)&local_98,iStack_90,(Offset<reflection::Object> *)&local_148);
      }
      else {
        (iStack_90._M_current)->o = OVar7.o;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      pSVar1 = *ppSVar15;
      (pSVar1->super_Definition).serialized_location = local_148._M_dataplus._M_p._0_4_;
      pbVar2 = (pSVar1->super_Definition).declaration_file;
      if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,pbVar2);
      }
      ppSVar15 = ppSVar15 + 1;
    } while (ppSVar15 !=
             (local_128->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_b8 = (Offset<reflection::Enum> *)0x0;
  iStack_b0._M_current = (Offset<reflection::Enum> *)0x0;
  local_a8 = (Offset<reflection::Enum> *)0x0;
  ppEVar16 = (local_128->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar16 !=
      (local_128->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      OVar8 = EnumDef::Serialize(*ppEVar16,this_00,local_128);
      local_148._M_dataplus._M_p._0_4_ = OVar8.o;
      if (iStack_b0._M_current == local_a8) {
        std::
        vector<flatbuffers::Offset<reflection::Enum>,std::allocator<flatbuffers::Offset<reflection::Enum>>>
        ::_M_realloc_insert<flatbuffers::Offset<reflection::Enum>const&>
                  ((vector<flatbuffers::Offset<reflection::Enum>,std::allocator<flatbuffers::Offset<reflection::Enum>>>
                    *)&local_b8,iStack_b0,(Offset<reflection::Enum> *)&local_148);
      }
      else {
        (iStack_b0._M_current)->o = OVar8.o;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      pbVar2 = ((*ppEVar16)->super_Definition).declaration_file;
      if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,pbVar2);
      }
      ppEVar16 = ppEVar16 + 1;
    } while (ppEVar16 !=
             (local_128->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_d8 = (Offset<reflection::Service> *)0x0;
  iStack_d0._M_current = (Offset<reflection::Service> *)0x0;
  local_c8 = (Offset<reflection::Service> *)0x0;
  ppSVar17 = (local_128->services_).vec.
             super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar17 !=
      (local_128->services_).vec.
      super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      OVar9 = ServiceDef::Serialize(*ppSVar17,this_00,local_128);
      local_148._M_dataplus._M_p._0_4_ = OVar9.o;
      if (iStack_d0._M_current == local_c8) {
        std::
        vector<flatbuffers::Offset<reflection::Service>,std::allocator<flatbuffers::Offset<reflection::Service>>>
        ::_M_realloc_insert<flatbuffers::Offset<reflection::Service>const&>
                  ((vector<flatbuffers::Offset<reflection::Service>,std::allocator<flatbuffers::Offset<reflection::Service>>>
                    *)&local_d8,iStack_d0,(Offset<reflection::Service> *)&local_148);
      }
      else {
        (iStack_d0._M_current)->o = OVar9.o;
        iStack_d0._M_current = iStack_d0._M_current + 1;
      }
      pbVar2 = ((*ppSVar17)->super_Definition).declaration_file;
      if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,pbVar2);
      }
      ppSVar17 = ppSVar17 + 1;
    } while (ppSVar17 !=
             (local_128->services_).vec.
             super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((local_128->opts).project_root._M_string_length == 0) {
    off_00.o = 0;
    pPVar18 = local_128;
  }
  else {
    local_f8 = (Offset<reflection::SchemaFile> *)0x0;
    iStack_f0._M_current = (Offset<reflection::SchemaFile> *)0x0;
    local_e8 = (Offset<reflection::SchemaFile> *)0x0;
    local_108 = (Offset<flatbuffers::String> *)0x0;
    local_118 = (Offset<flatbuffers::String> *)0x0;
    iStack_110._M_current = (Offset<flatbuffers::String> *)0x0;
    p_Var14 = (local_128->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    local_78 = &(local_128->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var14 != local_78) {
      project = &(local_128->opts).project_root;
      do {
        pPVar18 = local_128;
        FilePath(&local_148,project,(string *)(p_Var14 + 1),
                 (local_128->opts).binary_schema_absolute_paths);
        local_11c = FlatBufferBuilderImpl<false>::CreateSharedString
                              (this_00,local_148._M_dataplus._M_p,
                               CONCAT44(local_148._M_string_length._4_4_,
                                        (uint)local_148._M_string_length));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        local_70 = p_Var14;
        for (p_Var13 = p_Var14[2]._M_right; p_Var13 != (_Rb_tree_node_base *)&p_Var14[2]._M_parent;
            p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
          FilePath(&local_148,project,(string *)(p_Var13 + 2),
                   (pPVar18->opts).binary_schema_absolute_paths);
          local_64 = FlatBufferBuilderImpl<false>::CreateSharedString
                               (this_00,local_148._M_dataplus._M_p,
                                CONCAT44(local_148._M_string_length._4_4_,
                                         (uint)local_148._M_string_length));
          if (iStack_110._M_current == local_108) {
            std::
            vector<flatbuffers::Offset<flatbuffers::String>,std::allocator<flatbuffers::Offset<flatbuffers::String>>>
            ::_M_realloc_insert<flatbuffers::Offset<flatbuffers::String>>
                      ((vector<flatbuffers::Offset<flatbuffers::String>,std::allocator<flatbuffers::Offset<flatbuffers::String>>>
                        *)&local_118,iStack_110,&local_64);
          }
          else {
            (iStack_110._M_current)->o = local_64.o;
            iStack_110._M_current = iStack_110._M_current + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
        }
        v = local_118;
        if ((long)iStack_110._M_current - (long)local_118 == 0) {
          v = (Offset<flatbuffers::String> *)
              &data<flatbuffers::Offset<flatbuffers::String>,std::allocator<flatbuffers::Offset<flatbuffers::String>>>(std::vector<flatbuffers::Offset<flatbuffers::String>,std::allocator<flatbuffers::Offset<flatbuffers::String>>>const&)
               ::t;
        }
        off = FlatBufferBuilderImpl<false>::CreateVector<flatbuffers::String>
                        (this_00,v,(long)iStack_110._M_current - (long)local_118 >> 2);
        if (iStack_110._M_current != local_118) {
          iStack_110._M_current = local_118;
        }
        FlatBufferBuilderImpl<false>::NotNested(this_00);
        (local_128->builder_).nested = true;
        start = (local_128->builder_).buf_.size_;
        FlatBufferBuilderImpl<false>::
        AddOffset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>>
                  (this_00,6,off);
        p_Var14 = local_70;
        FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(this_00,4,local_11c);
        table.o = FlatBufferBuilderImpl<false>::EndTable(this_00,start);
        FlatBufferBuilderImpl<false>::Required<reflection::SchemaFile>(this_00,table,4);
        local_148._M_dataplus._M_p._0_4_ = table.o;
        if (iStack_f0._M_current == local_e8) {
          std::
          vector<flatbuffers::Offset<reflection::SchemaFile>,std::allocator<flatbuffers::Offset<reflection::SchemaFile>>>
          ::_M_realloc_insert<flatbuffers::Offset<reflection::SchemaFile>>
                    ((vector<flatbuffers::Offset<reflection::SchemaFile>,std::allocator<flatbuffers::Offset<reflection::SchemaFile>>>
                      *)&local_f8,iStack_f0,(Offset<reflection::SchemaFile> *)&local_148);
        }
        else {
          (iStack_f0._M_current)->o = table.o;
          iStack_f0._M_current = iStack_f0._M_current + 1;
        }
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while (p_Var14 != local_78);
    }
    pPVar18 = local_128;
    v_00 = (Offset<reflection::SchemaFile> *)
           &data<flatbuffers::Offset<reflection::SchemaFile>,std::allocator<flatbuffers::Offset<reflection::SchemaFile>>>(std::vector<flatbuffers::Offset<reflection::SchemaFile>,std::allocator<flatbuffers::Offset<reflection::SchemaFile>>>&)
            ::t;
    if ((long)iStack_f0._M_current - (long)local_f8 != 0) {
      v_00 = local_f8;
    }
    off_00 = FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<reflection::SchemaFile>
                       (this_00,v_00,(long)iStack_f0._M_current - (long)local_f8 >> 2);
    if (local_118 != (Offset<flatbuffers::String> *)0x0) {
      operator_delete(local_118,(long)local_108 - (long)local_118);
    }
    if (local_f8 != (Offset<reflection::SchemaFile> *)0x0) {
      operator_delete(local_f8,(long)local_e8 - (long)local_f8);
    }
  }
  v_01 = (Offset<reflection::Object> *)
         &data<flatbuffers::Offset<reflection::Object>,std::allocator<flatbuffers::Offset<reflection::Object>>>(std::vector<flatbuffers::Offset<reflection::Object>,std::allocator<flatbuffers::Offset<reflection::Object>>>&)
          ::t;
  if ((long)iStack_90._M_current - (long)local_98 != 0) {
    v_01 = local_98;
  }
  OVar10 = FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<reflection::Object>
                     (this_00,v_01,(long)iStack_90._M_current - (long)local_98 >> 2);
  v_02 = (Offset<reflection::Enum> *)
         &data<flatbuffers::Offset<reflection::Enum>,std::allocator<flatbuffers::Offset<reflection::Enum>>>(std::vector<flatbuffers::Offset<reflection::Enum>,std::allocator<flatbuffers::Offset<reflection::Enum>>>&)
          ::t;
  if ((long)iStack_b0._M_current - (long)local_b8 != 0) {
    v_02 = local_b8;
  }
  OVar11 = FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<reflection::Enum>
                     (this_00,v_02,(long)iStack_b0._M_current - (long)local_b8 >> 2);
  FlatBufferBuilderImpl<false>::CreateStringImpl
            (this_00,(pPVar18->file_identifier_)._M_dataplus._M_p,
             (pPVar18->file_identifier_)._M_string_length);
  local_70 = (_Base_ptr)CONCAT44(local_70._4_4_,OVar11.o);
  local_128 = (Parser *)CONCAT44(local_128._4_4_,(pPVar18->builder_).buf_.size_);
  FlatBufferBuilderImpl<false>::CreateStringImpl
            (this_00,(pPVar18->file_extension_)._M_dataplus._M_p,
             (pPVar18->file_extension_)._M_string_length);
  uVar6 = (pPVar18->builder_).buf_.size_;
  v_03 = (Offset<reflection::Service> *)
         &data<flatbuffers::Offset<reflection::Service>,std::allocator<flatbuffers::Offset<reflection::Service>>>(std::vector<flatbuffers::Offset<reflection::Service>,std::allocator<flatbuffers::Offset<reflection::Service>>>&)
          ::t;
  if ((long)iStack_d0._M_current - (long)local_d8 != 0) {
    v_03 = local_d8;
  }
  off_01 = FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<reflection::Service>
                     (this_00,v_03,(long)iStack_d0._M_current - (long)local_d8 >> 2);
  local_78 = (_Base_ptr)CONCAT44(local_78._4_4_,OVar10.o);
  if (pPVar18->root_struct_def_ == (StructDef *)0x0) {
    OVar7.o = 0;
  }
  else {
    OVar7.o = (pPVar18->root_struct_def_->super_Definition).serialized_location;
  }
  uVar4 = pPVar18->advanced_features_;
  local_148._M_dataplus._M_p = (pointer)this_00;
  local_11c.o = uVar6;
  FlatBufferBuilderImpl<false>::NotNested(this_00);
  (pPVar18->builder_).nested = true;
  local_148._M_string_length._0_4_ = (pPVar18->builder_).buf_.size_;
  FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
            ((FlatBufferBuilderImpl<false> *)local_148._M_dataplus._M_p,0x10,(ulong)(uint)uVar4,0);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,unsigned_int>>
            ((FlatBufferBuilderImpl<false> *)local_148._M_dataplus._M_p,0x12,off_00);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,unsigned_int>>
            ((FlatBufferBuilderImpl<false> *)local_148._M_dataplus._M_p,0xe,off_01);
  FlatBufferBuilderImpl<false>::AddOffset<reflection::Object>
            ((FlatBufferBuilderImpl<false> *)local_148._M_dataplus._M_p,0xc,OVar7);
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>
            ((FlatBufferBuilderImpl<false> *)local_148._M_dataplus._M_p,10,local_11c);
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>
            ((FlatBufferBuilderImpl<false> *)local_148._M_dataplus._M_p,8,local_128._0_4_);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>,unsigned_int>>
            ((FlatBufferBuilderImpl<false> *)local_148._M_dataplus._M_p,6,local_70._0_4_);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>>
            ((FlatBufferBuilderImpl<false> *)local_148._M_dataplus._M_p,4,local_78._0_4_);
  root = reflection::SchemaBuilder::Finish((SchemaBuilder *)&local_148);
  FlatBufferBuilderImpl<false>::Finish(this_00,root.o,"BFBS",(pPVar18->opts).size_prefixed);
  if (local_d8 != (Offset<reflection::Service> *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  if (local_b8 != (Offset<reflection::Enum> *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_98 != (Offset<reflection::Object> *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void Parser::Serialize() {
  builder_.Clear();
  AssignIndices(structs_.vec);
  AssignIndices(enums_.vec);
  std::vector<Offset<reflection::Object>> object_offsets;
  std::set<std::string> files;
  for (auto it = structs_.vec.begin(); it != structs_.vec.end(); ++it) {
    auto offset = (*it)->Serialize(&builder_, *this);
    object_offsets.push_back(offset);
    (*it)->serialized_location = offset.o;
    const std::string *file = (*it)->declaration_file;
    if (file) files.insert(*file);
  }
  std::vector<Offset<reflection::Enum>> enum_offsets;
  for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
    auto offset = (*it)->Serialize(&builder_, *this);
    enum_offsets.push_back(offset);
    const std::string *file = (*it)->declaration_file;
    if (file) files.insert(*file);
  }
  std::vector<Offset<reflection::Service>> service_offsets;
  for (auto it = services_.vec.begin(); it != services_.vec.end(); ++it) {
    auto offset = (*it)->Serialize(&builder_, *this);
    service_offsets.push_back(offset);
    const std::string *file = (*it)->declaration_file;
    if (file) files.insert(*file);
  }

  // Create Schemafiles vector of tables.
  flatbuffers::Offset<
      flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>>>
      schema_files__;
  if (!opts.project_root.empty()) {
    std::vector<Offset<reflection::SchemaFile>> schema_files;
    std::vector<Offset<flatbuffers::String>> included_files;
    for (auto f = files_included_per_file_.begin();
         f != files_included_per_file_.end(); f++) {

      const auto filename__ = builder_.CreateSharedString(FilePath(
          opts.project_root, f->first, opts.binary_schema_absolute_paths));
      for (auto i = f->second.begin(); i != f->second.end(); i++) {
        included_files.push_back(builder_.CreateSharedString(
            FilePath(opts.project_root, i->filename, opts.binary_schema_absolute_paths)));
      }
      const auto included_files__ = builder_.CreateVector(included_files);
      included_files.clear();

      schema_files.push_back(
          reflection::CreateSchemaFile(builder_, filename__, included_files__));
    }
    schema_files__ = builder_.CreateVectorOfSortedTables(&schema_files);
  }

  const auto objs__ = builder_.CreateVectorOfSortedTables(&object_offsets);
  const auto enum__ = builder_.CreateVectorOfSortedTables(&enum_offsets);
  const auto fiid__ = builder_.CreateString(file_identifier_);
  const auto fext__ = builder_.CreateString(file_extension_);
  const auto serv__ = builder_.CreateVectorOfSortedTables(&service_offsets);
  const auto schema_offset = reflection::CreateSchema(
      builder_, objs__, enum__, fiid__, fext__,
      (root_struct_def_ ? root_struct_def_->serialized_location : 0), serv__,
      static_cast<reflection::AdvancedFeatures>(advanced_features_),
      schema_files__);
  if (opts.size_prefixed) {
    builder_.FinishSizePrefixed(schema_offset, reflection::SchemaIdentifier());
  } else {
    builder_.Finish(schema_offset, reflection::SchemaIdentifier());
  }
}